

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::PulseStyleDeclarationSyntax::PulseStyleDeclarationSyntax
          (PulseStyleDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *inputs,Token semi)

{
  Token TVar1;
  bool bVar2;
  NameSyntax *pNVar3;
  undefined8 uVar4;
  NameSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *inputs_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  PulseStyleDeclarationSyntax *this_local;
  Token keyword_local;
  
  TVar1 = semi;
  uVar4 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,PulseStyleDeclaration,attributes);
  (this->keyword).kind = (short)uVar4;
  (this->keyword).field_0x2 = (char)((ulong)uVar4 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar4 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar4 >> 0x20);
  (this->keyword).info = keyword.info;
  SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList(&this->inputs,inputs);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ = SeparatedSyntaxList<slang::syntax::NameSyntax>::begin(&this->inputs)
  ;
  _child = SeparatedSyntaxList<slang::syntax::NameSyntax>::end(&this->inputs);
  while( true ) {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
                          *)&__end2.index,(iterator_base<slang::syntax::NameSyntax_*> *)&child);
    if (!bVar2) break;
    pNVar3 = SeparatedSyntaxList<slang::syntax::NameSyntax>::
             iterator_base<slang::syntax::NameSyntax_*>::operator*
                       ((iterator_base<slang::syntax::NameSyntax_*> *)&__end2.index);
    (pNVar3->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

PulseStyleDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<NameSyntax>& inputs, Token semi) :
        MemberSyntax(SyntaxKind::PulseStyleDeclaration, attributes), keyword(keyword), inputs(inputs), semi(semi) {
        this->inputs.parent = this;
        for (auto child : this->inputs)
            child->parent = this;
    }